

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-knowledge.c
# Opt level: O2

void object_flavor_aware(player *p,object *obj)

{
  uint32_t *puVar1;
  object_kind *kind;
  _Bool _Var2;
  chunk_conflict *pcVar3;
  loc grid;
  object *poVar4;
  int y;
  store *psVar5;
  long lVar6;
  int x;
  object **ppoVar7;
  
  poVar4 = obj->known;
  if (poVar4 == (object *)0x0) {
    __assert_fail("obj->known",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-knowledge.c"
                  ,0x938,"void object_flavor_aware(struct player *, struct object *)");
  }
  kind = obj->kind;
  if (kind->aware == false) {
    kind->aware = true;
    poVar4->effect = obj->effect;
    _Var2 = kind_is_ignored_unaware(kind);
    if (_Var2) {
      kind_ignore_when_aware(obj->kind);
    }
    puVar1 = &p->upkeep->notice;
    *puVar1 = *puVar1 | 2;
    ppoVar7 = &p->gear;
    while (poVar4 = *ppoVar7, poVar4 != (object *)0x0) {
      object_set_base_known(p,poVar4);
      ppoVar7 = &poVar4->next;
    }
    for (lVar6 = 0; lVar6 < world->num_towns; lVar6 = lVar6 + 1) {
      psVar5 = (store *)&world->towns[lVar6].stores;
      while (psVar5 = psVar5->next, psVar5 != (store *)0x0) {
        ppoVar7 = &psVar5->stock;
        while (poVar4 = *ppoVar7, poVar4 != (object *)0x0) {
          object_set_base_known(p,poVar4);
          ppoVar7 = &poVar4->next;
        }
      }
    }
    if (cave != (chunk_conflict *)0x0) {
      pcVar3 = cave;
      for (y = 1; y < pcVar3->height; y = y + 1) {
        for (x = 1; x < pcVar3->width; x = x + 1) {
          grid = (loc)loc(x,y);
          for (poVar4 = square_object(cave,grid); poVar4 != (object *)0x0; poVar4 = poVar4->next) {
            if (poVar4->kind == obj->kind) {
              square_light_spot((chunk *)cave,grid);
              break;
            }
          }
          pcVar3 = cave;
        }
      }
    }
  }
  return;
}

Assistant:

void object_flavor_aware(struct player *p, struct object *obj)
{
	int y, x, i;
	struct object *obj1;

	assert(obj->known);
	if (obj->kind->aware) return;
	obj->kind->aware = true;
	obj->known->effect = obj->effect;

	/* Fix ignore/autoinscribe */
	if (kind_is_ignored_unaware(obj->kind))
		kind_ignore_when_aware(obj->kind);
	p->upkeep->notice |= PN_IGNORE;

	/* Update player objects */
	for (obj1 = p->gear; obj1; obj1 = obj1->next)
		object_set_base_known(p, obj1);

	/* Store objects */
	for (i = 0; i < world->num_towns; i++) {
		struct town *town = &world->towns[i];
		struct store *s = town->stores;
		while (s) {
			for (obj1 = s->stock; obj1; obj1 = obj1->next) {
				object_set_base_known(p, obj1);
			}
			s = s->next;
		}
	}

	/* Quit if no dungeon yet */
	if (!cave) return;

	/* Some objects change tile on awareness, so update display for all
	 * floor objects of this kind */
	for (y = 1; y < cave->height; y++) {
		for (x = 1; x < cave->width; x++) {
			bool light = false;
			const struct object *floor_obj;
			struct loc grid = loc(x, y);

			for (floor_obj = square_object(cave, grid); floor_obj;
				 floor_obj = floor_obj->next)
				if (floor_obj->kind == obj->kind) {
					light = true;
					break;
				}

			if (light) square_light_spot(cave, grid);
		}
	}
}